

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitConstantArgsToFltArray
               (ByteCodeGenerator *byteCodeGenerator,double *vars,ParseNode *args,uint argCount)

{
  code *pcVar1;
  OpCode OVar2;
  undefined4 *puVar3;
  ParseNodeBin *pPVar4;
  ParseNodeInt *pPVar5;
  ParseNodeFloat *pPVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  
  OVar2 = args->nop;
  bVar8 = argCount != 0;
  uVar7 = 0;
  if (bVar8 && OVar2 == knopList) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar7 = 0;
    do {
      pPVar4 = ParseNode::AsParseNodeBin(args);
      OVar2 = pPVar4->pnode1->nop;
      if (OVar2 == knopFlt) {
LAB_0081d0d8:
        pPVar4 = ParseNode::AsParseNodeBin(args);
        pPVar6 = ParseNode::AsParseNodeFloat(pPVar4->pnode1);
        dVar9 = pPVar6->dbl;
      }
      else {
        if (OVar2 != knopInt) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x1e6b,"(nop == knopFlt)","nop == knopFlt");
          if (bVar8) {
            *puVar3 = 0;
            goto LAB_0081d0d8;
          }
          goto LAB_0081d214;
        }
        pPVar4 = ParseNode::AsParseNodeBin(args);
        pPVar5 = ParseNode::AsParseNodeInt(pPVar4->pnode1);
        dVar9 = (double)pPVar5->lw;
      }
      vars[uVar7] = dVar9;
      uVar7 = uVar7 + 1;
      pPVar4 = ParseNode::AsParseNodeBin(args);
      args = pPVar4->pnode2;
      OVar2 = args->nop;
      bVar8 = uVar7 < argCount;
    } while ((OVar2 == knopList) && (uVar7 < argCount));
  }
  if (!bVar8) {
    Js::Throw::InternalError();
  }
  if (OVar2 == knopFlt) {
LAB_0081d199:
    pPVar6 = ParseNode::AsParseNodeFloat(args);
    dVar9 = pPVar6->dbl;
  }
  else {
    if (OVar2 != knopInt) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1e7d,"(args->nop == knopFlt)","args->nop == knopFlt");
      if (!bVar8) goto LAB_0081d214;
      *puVar3 = 0;
      goto LAB_0081d199;
    }
    pPVar5 = ParseNode::AsParseNodeInt(args);
    dVar9 = (double)pPVar5->lw;
  }
  vars[uVar7 & 0xffffffff] = dVar9;
  if ((int)uVar7 + 1U != argCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1e81,"(index == argCount)","index == argCount");
    if (!bVar8) {
LAB_0081d214:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void EmitConstantArgsToFltArray(ByteCodeGenerator *byteCodeGenerator, __out_ecount(argCount) double *vars, ParseNode *args, uint argCount)
{
    uint index = 0;
    while (args->nop == knopList && index < argCount)
    {
        OpCode nop = args->AsParseNodeBin()->pnode1->nop;
        if (nop == knopInt)
        {
            vars[index++] = (double)args->AsParseNodeBin()->pnode1->AsParseNodeInt()->lw;
        }
        else
        {
            Assert(nop == knopFlt);
            vars[index++] = args->AsParseNodeBin()->pnode1->AsParseNodeFloat()->dbl;
        }
        args = args->AsParseNodeBin()->pnode2;
    }

    if (index >= argCount)
    {
        Js::Throw::InternalError();
        return;
    }

    if (args->nop == knopInt)
    {
        vars[index++] = (double)args->AsParseNodeInt()->lw;
    }
    else
    {
        Assert(args->nop == knopFlt);
        vars[index++] = args->AsParseNodeFloat()->dbl;
    }

    Assert(index == argCount);
}